

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

bool __thiscall
es32cts::RobustBufferAccessBehavior::ImageLoadStoreTest::verifyValidResults
          (ImageLoadStoreTest *this,GLuint texture_id)

{
  int iVar1;
  GLenum err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  reference pvVar3;
  ulong uVar4;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  reference pvVar8;
  MessageBuilder local_3a0;
  value_type local_220;
  value_type local_21c;
  GLuint drawn_red_1;
  GLuint expected_red_1;
  GLuint i_3;
  GLuint i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_1;
  float local_74;
  float local_70;
  GLfloat drawn_alpha;
  GLfloat drawn_blue;
  GLfloat drawn_green;
  GLfloat drawn_red;
  GLfloat expected_alpha;
  GLfloat expected_blue;
  GLfloat expected_green;
  GLfloat expected_red;
  GLuint i_1;
  GLuint i;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> pixels;
  bool result;
  Functions *gl;
  GLuint texture_id_local;
  ImageLoadStoreTest *this_local;
  Functions *gl_00;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  (*gl_00->memoryBarrier)(0x20);
  err = (*gl_00->getError)();
  glu::checkError(err,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                  ,0x414);
  pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  if ((this->super_TexelFetchTest).super_TexelFetchTest.m_test_case == RGBA32F) {
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl_00,texture_id,0xde1);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_40);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_40,0x400);
    for (expected_red = 0.0; (uint)expected_red < 0x100;
        expected_red = (GLfloat)((int)expected_red + 1)) {
      uVar4 = (ulong)(uint)expected_red;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,
                          (ulong)(uint)((int)expected_red << 2));
      *pvVar3 = (float)uVar4 * 0.00390625;
      uVar4 = (ulong)(uint)expected_red;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,
                          (ulong)((int)expected_red * 4 + 1));
      *pvVar3 = (float)uVar4 * 0.00390625;
      uVar4 = (ulong)(uint)expected_red;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,
                          (ulong)((int)expected_red * 4 + 2));
      *pvVar3 = (float)uVar4 * 0.00390625;
      uVar4 = (ulong)(uint)expected_red;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,
                          (ulong)((int)expected_red * 4 + 3));
      *pvVar3 = (float)uVar4 / 256.0;
    }
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_40,0);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl_00,texture_id,0,0x10,0x10,0x1908,0x1406,pvVar3);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl_00,0,0xde1);
    for (expected_green = 0.0; (uint)expected_green < 0x100;
        expected_green = (GLfloat)((int)expected_green + 1)) {
      expected_blue = (float)((uint)expected_green & 0xf) * 0.0625;
      expected_alpha = (float)((uint)expected_green >> 4) * 0.0625;
      drawn_red = (float)(uint)expected_green / 256.0;
      drawn_green = 1.0;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,
                          (ulong)(uint)((int)expected_green << 2));
      drawn_blue = *pvVar3;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,
                          (ulong)((int)expected_green * 4 + 1));
      drawn_alpha = *pvVar3;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,
                          (ulong)((int)expected_green * 4 + 2));
      local_70 = *pvVar3;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,
                          (ulong)((int)expected_green * 4 + 3));
      local_74 = *pvVar3;
      if (((((expected_blue != drawn_blue) || (NAN(expected_blue) || NAN(drawn_blue))) ||
           (expected_alpha != drawn_alpha)) ||
          ((NAN(expected_alpha) || NAN(drawn_alpha) || (drawn_red != local_70)))) ||
         ((NAN(drawn_red) || NAN(local_70) || ((local_74 != 1.0 || (NAN(local_74))))))) {
        pTVar5 = deqp::Context::getTestContext
                           ((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.
                            m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar5);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)
                   &pixels_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,pTVar6,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)
                            &pixels_1.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,
                            (char (*) [16])"Invalid value: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&drawn_blue);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&drawn_alpha);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_70);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_74);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [19])". Expected value: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&expected_blue);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&expected_alpha);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&drawn_red);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&drawn_green);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])". At offset: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&expected_green);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder
                  ((MessageBuilder *)
                   &pixels_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ = 0;
        break;
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_40);
  }
  else if ((this->super_TexelFetchTest).super_TexelFetchTest.m_test_case == R32UI_MIPMAP) {
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl_00,texture_id,0xde1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3,0x400);
    for (expected_red_1 = 0; expected_red_1 < 0x400; expected_red_1 = expected_red_1 + 1) {
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3,
                          (ulong)expected_red_1);
      *pvVar8 = 0;
    }
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3,0);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl_00,texture_id,1,0x10,0x10,0x8d99,0x1405,pvVar8);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl_00,0,0xde1);
    for (drawn_red_1 = 0; drawn_red_1 < 0x100; drawn_red_1 = drawn_red_1 + 1) {
      local_21c = drawn_red_1;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3,
                          (ulong)(drawn_red_1 << 2));
      local_220 = *pvVar8;
      if (local_21c != local_220) {
        pTVar5 = deqp::Context::getTestContext
                           ((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.
                            m_context);
        pTVar6 = tcu::TestContext::getLog(pTVar5);
        tcu::TestLog::operator<<(&local_3a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_3a0,(char (*) [16])"Invalid value: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_220);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [19])". Expected value: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_21c);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])" at offset: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&drawn_red_1);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3a0);
        pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ = 0;
        break;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3);
  }
  return (bool)(pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
}

Assistant:

bool ImageLoadStoreTest::verifyValidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();
	gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	bool result = true;

	if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = (GLfloat)(i % 16) / 16.0f;
			const GLfloat expected_green = (GLfloat)(i / 16) / 16.0f;
			const GLfloat expected_blue  = (GLfloat)i / 256.0f;
			const GLfloat expected_alpha = 1.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels * n_channels; ++i)
		{
			pixels[i] = 0;
		}

		Texture::GetData(gl, texture_id, 1 /* level */, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = i;
			const GLuint drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}